

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void mass_produce(object *obj)

{
  wchar_t wVar1;
  wchar_t wVar2;
  uint32_t uVar3;
  uint8_t local_24;
  int local_14;
  wchar_t cost;
  wchar_t size;
  object *obj_local;
  
  local_14 = 1;
  wVar1 = object_value_real(obj,L'\x01');
  switch(obj->tval) {
  case '\x02':
  case '\x03':
  case '\x04':
    if (wVar1 < L'\x06') {
      uVar3 = Rand_div(2);
      local_14 = (uVar3 + 1) * 0x14;
    }
    else if ((wVar1 < L'\x06') || (L'2' < wVar1)) {
      if ((wVar1 < L'3') || (L'Ǵ' < wVar1)) {
        local_14 = 1;
      }
      else {
        uVar3 = Rand_div(4);
        local_14 = (uVar3 + 1) * 5;
      }
    }
    else {
      uVar3 = Rand_div(4);
      local_14 = (uVar3 + 1) * 10;
    }
    break;
  case '\x05':
  case '\x06':
  case '\a':
  case '\b':
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
    if (obj->ego == (ego_item *)0x0) {
      if (wVar1 < L'\v') {
        wVar2 = mass_roll(L'\x03',L'\x05');
        local_14 = wVar2 + L'\x01';
      }
      if (wVar1 < L'e') {
        wVar1 = mass_roll(L'\x03',L'\x05');
        local_14 = wVar1 + local_14;
      }
    }
    break;
  case '\x13':
  case '\x1b':
  case '\x1c':
  case '\x1d':
    if (wVar1 < L'\x06') {
      wVar2 = mass_roll(L'\x03',L'\x05');
      local_14 = wVar2 + L'\x01';
    }
    if (wVar1 < L'\x15') {
      wVar1 = mass_roll(L'\x03',L'\x05');
      local_14 = wVar1 + local_14;
    }
    break;
  case '\x19':
  case '\x1a':
    if (wVar1 < L'=') {
      wVar2 = mass_roll(L'\x03',L'\x05');
      local_14 = wVar2 + L'\x01';
    }
    if (wVar1 < L'ñ') {
      wVar1 = mass_roll(L'\x01',L'\x05');
      local_14 = wVar1 + local_14;
    }
    break;
  case '\x1e':
  case '\x1f':
  case ' ':
  case '!':
  case '\"':
    if (wVar1 < L'3') {
      wVar2 = mass_roll(L'\x02',L'\x03');
      local_14 = wVar2 + L'\x01';
    }
    if (wVar1 < L'ǵ') {
      wVar1 = mass_roll(L'\x01',L'\x03');
      local_14 = wVar1 + local_14;
    }
  }
  if (obj->kind->base->max_stack < local_14) {
    local_24 = (uint8_t)obj->kind->base->max_stack;
  }
  else {
    local_24 = (uint8_t)local_14;
  }
  obj->number = local_24;
  return;
}

Assistant:

static void mass_produce(struct object *obj)
{
	int size = 1;
	int cost = object_value_real(obj, 1);

	/* Analyze the type */
	switch (obj->tval)
	{
		/* Food, Flasks, and Lights */
		case TV_FOOD:
		case TV_MUSHROOM:
		case TV_FLASK:
		case TV_LIGHT:
		{
			if (cost <= 5L) size += mass_roll(3, 5);
			if (cost <= 20L) size += mass_roll(3, 5);
			break;
		}

		case TV_POTION:
		case TV_SCROLL:
		{
			if (cost <= 60L) size += mass_roll(3, 5);
			if (cost <= 240L) size += mass_roll(1, 5);
			break;
		}

		case TV_MAGIC_BOOK:
		case TV_PRAYER_BOOK:
		case TV_NATURE_BOOK:
		case TV_SHADOW_BOOK:
		case TV_OTHER_BOOK:
		{
			if (cost <= 50L) size += mass_roll(2, 3);
			if (cost <= 500L) size += mass_roll(1, 3);
			break;
		}

		case TV_SOFT_ARMOR:
		case TV_HARD_ARMOR:
		case TV_SHIELD:
		case TV_GLOVES:
		case TV_BOOTS:
		case TV_CLOAK:
		case TV_HELM:
		case TV_CROWN:
		case TV_SWORD:
		case TV_POLEARM:
		case TV_HAFTED:
		case TV_DIGGING:
		case TV_BOW:
		{
			if (obj->ego) break;
			if (cost <= 10L) size += mass_roll(3, 5);
			if (cost <= 100L) size += mass_roll(3, 5);
			break;
		}

		case TV_SHOT:
		case TV_ARROW:
		case TV_BOLT:
		{
			if (cost <= 5L)
				size = randint1(2) * 20;         /* 20-40 in 20s */
			else if (cost > 5L && cost <= 50L)
				size = randint1(4) * 10;         /* 10-40 in 10s */
			else if (cost > 50 && cost <= 500L)
				size = randint1(4) * 5;          /* 5-20 in 5s */
			else
				size = 1;

			break;
		}
	}

	/* Save the total pile size */
	obj->number = MIN(size, obj->kind->base->max_stack);
}